

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_builder_unittest.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::PathBuilderKeyRolloverTest_TestDuplicateIntermediates_Test::TestBody
          (PathBuilderKeyRolloverTest_TestDuplicateIntermediates_Test *this)

{
  shared_ptr<const_bssl::ParsedCertificate> *lhs;
  shared_ptr<const_bssl::ParsedCertificate> *psVar1;
  shared_ptr<const_bssl::ParsedCertificate> *lhs_00;
  shared_ptr<const_bssl::ParsedCertificate> *lhs_01;
  element_type *peVar2;
  CertPathBuilderResultPath *pCVar3;
  long lVar4;
  bool bVar5;
  StatusCode SVar6;
  string *psVar7;
  char *pcVar8;
  char *pcVar9;
  Input local_320;
  AssertionResult gtest_ar_;
  AssertHelper local_300;
  VerifyError error;
  __uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> local_2c8;
  Result result;
  shared_ptr<const_bssl::ParsedCertificate> oldintermediate_dupe;
  __shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2> local_280;
  __shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2> local_270;
  __shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2> local_260;
  __shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2> local_250;
  __shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2> local_240;
  CertIssuerSourceStatic sync_certs2;
  CertIssuerSourceStatic sync_certs1;
  CertPathBuilder path_builder;
  AsyncCertIssuerSourceStatic async_certs;
  TrustStoreInMemory trust_store;
  
  peVar2 = (this->super_PathBuilderKeyRolloverTest).oldintermediate_.
           super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_2c8._M_t.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
       (tuple<crypto_buffer_st_*,_bssl::internal::Deleter>)
       CRYPTO_BUFFER_new((peVar2->cert_).data_.data_,(peVar2->cert_).data_.size_,
                         (CRYPTO_BUFFER_POOL *)0x0);
  path_builder.out_result_.paths.
  super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
  ParsedCertificate::Create
            ((ParsedCertificate *)&oldintermediate_dupe,(UniquePtr<CRYPTO_BUFFER> *)&local_2c8,
             (ParseCertificateOptions *)&path_builder,(CertErrors *)0x0);
  ::std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_2c8);
  TrustStoreInMemory::TrustStoreInMemory(&trust_store);
  lhs = &(this->super_PathBuilderKeyRolloverTest).newroot_;
  ::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_240,
             &lhs->super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>);
  TrustStoreInMemory::AddTrustAnchor
            (&trust_store,(shared_ptr<const_bssl::ParsedCertificate> *)&local_240);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_240._M_refcount);
  CertIssuerSourceStatic::CertIssuerSourceStatic(&sync_certs1);
  psVar1 = &(this->super_PathBuilderKeyRolloverTest).oldintermediate_;
  ::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_250,
             &psVar1->super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>)
  ;
  CertIssuerSourceStatic::AddCert
            (&sync_certs1,(shared_ptr<const_bssl::ParsedCertificate> *)&local_250);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_250._M_refcount);
  CertIssuerSourceStatic::CertIssuerSourceStatic(&sync_certs2);
  ::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_260,
             &oldintermediate_dupe.
              super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>);
  CertIssuerSourceStatic::AddCert
            (&sync_certs2,(shared_ptr<const_bssl::ParsedCertificate> *)&local_260);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_260._M_refcount);
  AsyncCertIssuerSourceStatic::AsyncCertIssuerSourceStatic(&async_certs);
  lhs_00 = &(this->super_PathBuilderKeyRolloverTest).newintermediate_;
  ::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_270,
             &lhs_00->super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>)
  ;
  AsyncCertIssuerSourceStatic::AddCert
            (&async_certs,(shared_ptr<const_bssl::ParsedCertificate> *)&local_270);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_270._M_refcount);
  lhs_01 = &(this->super_PathBuilderKeyRolloverTest).target_;
  ::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_280,
             &lhs_01->super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>)
  ;
  pcVar9 = (char *)0x0;
  CertPathBuilder::CertPathBuilder
            (&path_builder,(shared_ptr<const_bssl::ParsedCertificate> *)&local_280,
             &trust_store.super_TrustStore,
             &(this->super_PathBuilderKeyRolloverTest).delegate_.super_CertPathBuilderDelegate,
             &(this->super_PathBuilderKeyRolloverTest).time_,ANY_EKU,
             (this->super_PathBuilderKeyRolloverTest).initial_explicit_policy_,
             &(this->super_PathBuilderKeyRolloverTest).user_initial_policy_set_,
             (this->super_PathBuilderKeyRolloverTest).initial_policy_mapping_inhibit_,
             (this->super_PathBuilderKeyRolloverTest).initial_any_policy_inhibit_);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_280._M_refcount);
  CertPathBuilder::AddCertIssuerSource(&path_builder,&sync_certs1.super_CertIssuerSource);
  CertPathBuilder::AddCertIssuerSource(&path_builder,&sync_certs2.super_CertIssuerSource);
  CertPathBuilder::AddCertIssuerSource(&path_builder,&async_certs.super_CertIssuerSource);
  CertPathBuilder::Run(&result,&path_builder);
  bVar5 = CertPathBuilder::Result::HasValidPath(&result);
  gtest_ar_.success_ = bVar5;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar5) {
    testing::Message::Message((Message *)&local_320);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&error,(internal *)&gtest_ar_,(AssertionResult *)"result.HasValidPath()",
               "false","true",pcVar9);
    testing::internal::AssertHelper::AssertHelper
              (&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
               ,0x6d3,(char *)CONCAT71(error.offset_._1_7_,(char)error.offset_));
    testing::internal::AssertHelper::operator=(&local_300,(Message *)&local_320);
    testing::internal::AssertHelper::~AssertHelper(&local_300);
    ::std::__cxx11::string::~string((string *)&error);
    if ((long *)local_320.data_.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_320.data_.data_ + 8))();
    }
  }
  ::std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  local_320.data_.data_ = (uchar *)CONCAT44(local_320.data_.data_._4_4_,2);
  gtest_ar_._0_8_ =
       (long)result.paths.
             super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)result.paths.
             super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&error,"2U","result.paths.size()",(uint *)&local_320,
             (unsigned_long *)&gtest_ar_);
  if ((char)error.offset_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (error._8_8_ == 0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)error._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_320,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
               ,0x6d4,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_320,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_320);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  else {
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&error.code_);
    bVar5 = CertPathBuilderResultPath::IsValid
                      (((result.paths.
                         super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                       super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                       .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>._M_head_impl
                      );
    gtest_ar_.success_ = !bVar5;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (bVar5) {
      testing::Message::Message((Message *)&local_320);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&error,(internal *)&gtest_ar_,
                 (AssertionResult *)"result.paths[0]->IsValid()","true","false",pcVar9);
      testing::internal::AssertHelper::AssertHelper
                (&local_300,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                 ,0x6d8,(char *)CONCAT71(error.offset_._1_7_,(char)error.offset_));
      testing::internal::AssertHelper::operator=(&local_300,(Message *)&local_320);
      testing::internal::AssertHelper::~AssertHelper(&local_300);
      ::std::__cxx11::string::~string((string *)&error);
      if ((long *)local_320.data_.data_ != (long *)0x0) {
        (**(code **)(*(long *)local_320.data_.data_ + 8))();
      }
    }
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    pCVar3 = ((result.paths.
               super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
             ._M_t.
             super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
             .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>._M_head_impl;
    local_320.data_.data_ = (uchar *)CONCAT44(local_320.data_.data_._4_4_,3);
    gtest_ar_._0_8_ =
         (long)*(pointer *)
                ((long)&(pCVar3->certs).
                        super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                + 8) -
         *(long *)&(pCVar3->certs).
                   super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
         >> 4;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)&error,"3U","path0.certs.size()",(uint *)&local_320,
               (unsigned_long *)&gtest_ar_);
    if ((char)error.offset_ == '\0') {
      testing::Message::Message((Message *)&gtest_ar_);
      if (error._8_8_ == 0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = *(char **)error._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_320,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                 ,0x6db,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_320,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_320);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    else {
      ::std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&error.code_);
      testing::internal::
      CmpHelperEQ<std::shared_ptr<bssl::ParsedCertificate_const>,std::shared_ptr<bssl::ParsedCertificate_const>>
                ((internal *)&error,"target_","path0.certs[0]",lhs_01,
                 *(shared_ptr<const_bssl::ParsedCertificate> **)
                  &(pCVar3->certs).
                   super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                );
      if ((char)error.offset_ == '\0') {
        testing::Message::Message((Message *)&gtest_ar_);
        if (error._8_8_ == 0) {
          pcVar8 = "";
        }
        else {
          pcVar8 = *(char **)error._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_320,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                   ,0x6dc,pcVar8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_320,(Message *)&gtest_ar_)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_320);
        if (gtest_ar_._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
      ::std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&error.code_);
      peVar2 = (psVar1->
               super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      gtest_ar_._0_8_ = (peVar2->cert_).data_.data_;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(peVar2->cert_).data_.size_;
      lVar4 = *(long *)(*(long *)&(pCVar3->certs).
                                  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                       + 0x10);
      local_320.data_.data_ = *(uchar **)(lVar4 + 8);
      local_320.data_.size_ = *(size_t *)(lVar4 + 0x10);
      testing::internal::CmpHelperEQ<bssl::der::Input,bssl::der::Input>
                ((internal *)&error,"oldintermediate_->der_cert()","path0.certs[1]->der_cert()",
                 (Input *)&gtest_ar_,&local_320);
      if ((char)error.offset_ == '\0') {
        testing::Message::Message((Message *)&gtest_ar_);
        if (error._8_8_ == 0) {
          pcVar8 = "";
        }
        else {
          pcVar8 = *(char **)error._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_320,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                   ,0x6df,pcVar8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_320,(Message *)&gtest_ar_)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_320);
        if (gtest_ar_._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
      ::std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&error.code_);
      testing::internal::
      CmpHelperEQ<std::shared_ptr<bssl::ParsedCertificate_const>,std::shared_ptr<bssl::ParsedCertificate_const>>
                ((internal *)&error,"newroot_","path0.certs[2]",lhs,
                 (shared_ptr<const_bssl::ParsedCertificate> *)
                 (*(long *)&(pCVar3->certs).
                            super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                 + 0x20));
      if ((char)error.offset_ == '\0') {
        testing::Message::Message((Message *)&gtest_ar_);
        if (error._8_8_ == 0) {
          pcVar8 = "";
        }
        else {
          pcVar8 = *(char **)error._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_320,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                   ,0x6e0,pcVar8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_320,(Message *)&gtest_ar_)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_320);
        if (gtest_ar_._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
      ::std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&error.code_);
      gtest_ar_._0_4_ = 1;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)&error,"1U","result.best_result_index",(uint *)&gtest_ar_,
                 &result.best_result_index);
      if ((char)error.offset_ == '\0') {
        testing::Message::Message((Message *)&gtest_ar_);
        if (error._8_8_ == 0) {
          pcVar8 = "";
        }
        else {
          pcVar8 = *(char **)error._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_320,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                   ,0x6e4,pcVar8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_320,(Message *)&gtest_ar_)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_320);
        if (gtest_ar_._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
      ::std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&error.code_);
      bVar5 = CertPathBuilderResultPath::IsValid
                        (result.paths.
                         super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                         super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                         .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>.
                         _M_head_impl);
      gtest_ar_.success_ = bVar5;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (!bVar5) {
        testing::Message::Message((Message *)&local_320);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&error,(internal *)&gtest_ar_,
                   (AssertionResult *)"result.paths[1]->IsValid()","false","true",pcVar9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_300,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                   ,0x6e5,(char *)CONCAT71(error.offset_._1_7_,(char)error.offset_));
        testing::internal::AssertHelper::operator=(&local_300,(Message *)&local_320);
        testing::internal::AssertHelper::~AssertHelper(&local_300);
        ::std::__cxx11::string::~string((string *)&error);
        if ((long *)local_320.data_.data_ != (long *)0x0) {
          (**(code **)(*(long *)local_320.data_.data_ + 8))();
        }
      }
      ::std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      pCVar3 = result.paths.
               super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
               super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
               ._M_t.
               super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
               .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>._M_head_impl;
      local_320.data_.data_ = (uchar *)CONCAT44(local_320.data_.data_._4_4_,3);
      gtest_ar_._0_8_ =
           (long)*(pointer *)
                  ((long)&(pCVar3->certs).
                          super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                  + 8) -
           *(long *)&(pCVar3->certs).
                     super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
           >> 4;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)&error,"3U","path1.certs.size()",(uint *)&local_320,
                 (unsigned_long *)&gtest_ar_);
      if ((char)error.offset_ != '\0') {
        ::std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&error.code_);
        testing::internal::
        CmpHelperEQ<std::shared_ptr<bssl::ParsedCertificate_const>,std::shared_ptr<bssl::ParsedCertificate_const>>
                  ((internal *)&error,"target_","path1.certs[0]",lhs_01,
                   *(shared_ptr<const_bssl::ParsedCertificate> **)
                    &(pCVar3->certs).
                     super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                  );
        if ((char)error.offset_ == '\0') {
          testing::Message::Message((Message *)&gtest_ar_);
          if (error._8_8_ == 0) {
            pcVar9 = "";
          }
          else {
            pcVar9 = *(char **)error._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_320,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                     ,0x6e8,pcVar9);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_320,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_320);
          if (gtest_ar_._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
        }
        ::std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&error.code_);
        testing::internal::
        CmpHelperEQ<std::shared_ptr<bssl::ParsedCertificate_const>,std::shared_ptr<bssl::ParsedCertificate_const>>
                  ((internal *)&error,"newintermediate_","path1.certs[1]",lhs_00,
                   (shared_ptr<const_bssl::ParsedCertificate> *)
                   (*(long *)&(pCVar3->certs).
                              super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                   + 0x10));
        if ((char)error.offset_ == '\0') {
          testing::Message::Message((Message *)&gtest_ar_);
          if (error._8_8_ == 0) {
            pcVar9 = "";
          }
          else {
            pcVar9 = *(char **)error._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_320,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                     ,0x6e9,pcVar9);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_320,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_320);
          if (gtest_ar_._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
        }
        ::std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&error.code_);
        testing::internal::
        CmpHelperEQ<std::shared_ptr<bssl::ParsedCertificate_const>,std::shared_ptr<bssl::ParsedCertificate_const>>
                  ((internal *)&error,"newroot_","path1.certs[2]",lhs,
                   (shared_ptr<const_bssl::ParsedCertificate> *)
                   (*(long *)&(pCVar3->certs).
                              super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                   + 0x20));
        if ((char)error.offset_ == '\0') {
          testing::Message::Message((Message *)&gtest_ar_);
          if (error._8_8_ == 0) {
            pcVar9 = "";
          }
          else {
            pcVar9 = *(char **)error._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_320,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                     ,0x6ea,pcVar9);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_320,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_320);
          if (gtest_ar_._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
        }
        ::std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&error.code_);
        CertPathBuilder::Result::GetBestPathVerifyError(&error,&result);
        SVar6 = VerifyError::Code(&error);
        local_320.data_.data_ = (uchar *)CONCAT44(local_320.data_.data_._4_4_,SVar6);
        local_300.data_._0_4_ = 0;
        testing::internal::CmpHelperEQ<bssl::VerifyError::StatusCode,bssl::VerifyError::StatusCode>
                  ((internal *)&gtest_ar_,"error.Code()","VerifyError::StatusCode::PATH_VERIFIED",
                   (StatusCode *)&local_320,(StatusCode *)&local_300);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&local_320);
          psVar7 = VerifyError::DiagnosticString_abi_cxx11_(&error);
          ::std::operator<<((ostream *)((long)local_320.data_.data_ + 0x10),(string *)psVar7);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar9 = "";
          }
          else {
            pcVar9 = *(char **)gtest_ar_.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_300,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                     ,0x6ed,pcVar9);
          testing::internal::AssertHelper::operator=(&local_300,(Message *)&local_320);
          testing::internal::AssertHelper::~AssertHelper(&local_300);
          if ((long *)local_320.data_.data_ != (long *)0x0) {
            (**(code **)(*(long *)local_320.data_.data_ + 8))();
          }
        }
        ::std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        ::std::__cxx11::string::~string((string *)&error.diagnostic_);
        goto LAB_002c1542;
      }
      testing::Message::Message((Message *)&gtest_ar_);
      if (error._8_8_ == 0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = *(char **)error._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_320,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                 ,0x6e7,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_320,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_320);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
  }
  ::std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&error.code_);
LAB_002c1542:
  CertPathBuilder::Result::~Result(&result);
  CertPathBuilder::~CertPathBuilder(&path_builder);
  AsyncCertIssuerSourceStatic::~AsyncCertIssuerSourceStatic(&async_certs);
  CertIssuerSourceStatic::~CertIssuerSourceStatic(&sync_certs2);
  CertIssuerSourceStatic::~CertIssuerSourceStatic(&sync_certs1);
  TrustStoreInMemory::~TrustStoreInMemory(&trust_store);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&oldintermediate_dupe.
              super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST_F(PathBuilderKeyRolloverTest, TestDuplicateIntermediates) {
  // Create a separate copy of oldintermediate.
  std::shared_ptr<const ParsedCertificate> oldintermediate_dupe(
      ParsedCertificate::Create(
          bssl::UniquePtr<CRYPTO_BUFFER>(
              CRYPTO_BUFFER_new(oldintermediate_->der_cert().data(),
                                oldintermediate_->der_cert().size(), nullptr)),
          {}, nullptr));

  // Only newroot is a trusted root.
  TrustStoreInMemory trust_store;
  trust_store.AddTrustAnchor(newroot_);

  // The oldintermediate is supplied synchronously by |sync_certs1| and
  // another copy of oldintermediate is supplied synchronously by |sync_certs2|.
  // The path target <- oldintermediate <- newroot  should be built first,
  // though it won't verify. It should not be attempted again even though
  // oldintermediate was supplied twice.
  CertIssuerSourceStatic sync_certs1;
  sync_certs1.AddCert(oldintermediate_);
  CertIssuerSourceStatic sync_certs2;
  sync_certs2.AddCert(oldintermediate_dupe);

  // The newintermediate is supplied asynchronously, so the path
  // target <- newintermediate <- newroot should be tried second.
  AsyncCertIssuerSourceStatic async_certs;
  async_certs.AddCert(newintermediate_);

  CertPathBuilder path_builder(
      target_, &trust_store, &delegate_, time_, KeyPurpose::ANY_EKU,
      initial_explicit_policy_, user_initial_policy_set_,
      initial_policy_mapping_inhibit_, initial_any_policy_inhibit_);
  path_builder.AddCertIssuerSource(&sync_certs1);
  path_builder.AddCertIssuerSource(&sync_certs2);
  path_builder.AddCertIssuerSource(&async_certs);

  auto result = path_builder.Run();

  EXPECT_TRUE(result.HasValidPath());
  ASSERT_EQ(2U, result.paths.size());

  // Path builder will first attempt: target <- oldintermediate <- newroot
  // but it will fail since oldintermediate is signed by oldroot.
  EXPECT_FALSE(result.paths[0]->IsValid());
  const auto &path0 = *result.paths[0];

  ASSERT_EQ(3U, path0.certs.size());
  EXPECT_EQ(target_, path0.certs[0]);
  // Compare the DER instead of ParsedCertificate pointer, don't care which copy
  // of oldintermediate was used in the path.
  EXPECT_EQ(oldintermediate_->der_cert(), path0.certs[1]->der_cert());
  EXPECT_EQ(newroot_, path0.certs[2]);

  // Path builder will next attempt: target <- newintermediate <- newroot
  // which will succeed.
  EXPECT_EQ(1U, result.best_result_index);
  EXPECT_TRUE(result.paths[1]->IsValid());
  const auto &path1 = *result.paths[1];
  ASSERT_EQ(3U, path1.certs.size());
  EXPECT_EQ(target_, path1.certs[0]);
  EXPECT_EQ(newintermediate_, path1.certs[1]);
  EXPECT_EQ(newroot_, path1.certs[2]);

  VerifyError error = result.GetBestPathVerifyError();
  ASSERT_EQ(error.Code(), VerifyError::StatusCode::PATH_VERIFIED)
      << error.DiagnosticString();
}